

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

int __thiscall
ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::open
          (basic_ofstream<char,_std::char_traits<char>_> *this,char *__file,int __oflag,...)

{
  int iVar1;
  string local_38;
  
  path::string_abi_cxx11_(&local_38,(path *)__file);
  std::ofstream::open((char *)this,(_Ios_Openmode)local_38._M_dataplus._M_p);
  iVar1 = std::__cxx11::string::~string((string *)&local_38);
  return iVar1;
}

Assistant:

void open(const path& p, std::ios_base::openmode mode = std::ios_base::out) { std::basic_ofstream<charT, traits>::open(p.string().c_str(), mode); }